

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

bool __thiscall
FillableSigningProvider::GetKey(FillableSigningProvider *this,CKeyID *address,CKey *keyOut)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->cs_KeyStore).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  cVar1 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::find(&(this->mapKeys)._M_t,address);
  p_Var2 = &(this->mapKeys)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    CKey::operator=(keyOut,(CKey *)&cVar1._M_node[1]._M_right);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (_Rb_tree_header *)cVar1._M_node != p_Var2;
  }
  __stack_chk_fail();
}

Assistant:

bool FillableSigningProvider::GetKey(const CKeyID &address, CKey &keyOut) const
{
    LOCK(cs_KeyStore);
    KeyMap::const_iterator mi = mapKeys.find(address);
    if (mi != mapKeys.end()) {
        keyOut = mi->second;
        return true;
    }
    return false;
}